

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_set.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalSet::GetData
          (PhysicalSet *this,ExecutionContext *context,DataChunk *chunk,OperatorSourceInput *input)

{
  string *name;
  ClientContext *context_00;
  DBConfig *pDVar1;
  ConfigurationOption *pCVar2;
  DatabaseInstance *db;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_true>
  _Var3;
  InternalException *this_00;
  CatalogException *pCVar4;
  SetScope SVar5;
  allocator local_e9;
  optional_ptr<const_duckdb::ConfigurationOption,_true> option;
  string local_e0;
  LogicalType local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Value input_val;
  
  pDVar1 = DBConfig::GetConfig(context->client);
  name = &this->name;
  DBConfig::CheckLock(pDVar1,name);
  option = DBConfig::GetOptionByName(name);
  if (option.ptr == (ConfigurationOption *)0x0) {
    _Var3._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(pDVar1->extension_parameters)._M_h,name);
    if (_Var3._M_cur == (__node_type *)0x0) {
      Catalog::AutoloadExtensionByConfigName(context->client,name);
      _Var3._M_cur = (__node_type *)
                     ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(pDVar1->extension_parameters)._M_h,name);
    }
    SetExtensionVariable
              (context->client,
               (ExtensionOption *)
               ((long)&((_Var3._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>
                       ._M_storage._M_storage + 0x20),name,this->scope,&this->value);
  }
  else {
    SVar5 = this->scope;
    if (SVar5 == AUTOMATIC) {
      pCVar2 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
      SVar5 = pCVar2->set_local == (set_local_function_t)0x0 | SESSION;
    }
    context_00 = context->client;
    pCVar2 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
    ::std::__cxx11::string::string((string *)&local_e0,pCVar2->parameter_type,&local_e9);
    DBConfig::ParseLogicalType(&local_c0,&local_e0);
    Value::CastAs(&input_val,&this->value,context_00,&local_c0,false);
    LogicalType::~LogicalType(&local_c0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    if (SVar5 == SESSION) {
      pCVar2 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
      if (pCVar2->set_local == (set_local_function_t)0x0) {
        pCVar4 = (CatalogException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_e0,"option \"%s\" cannot be set locally",(allocator *)&local_c0)
        ;
        ::std::__cxx11::string::string((string *)&local_a8,(string *)name);
        CatalogException::CatalogException<std::__cxx11::string>(pCVar4,&local_e0,&local_a8);
        __cxa_throw(pCVar4,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pCVar2 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
      (*pCVar2->set_local)(context->client,&input_val);
    }
    else {
      if (SVar5 != GLOBAL) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_e0,"Unsupported SetScope for variable",(allocator *)&local_c0);
        InternalException::InternalException(this_00,(string *)&local_e0);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pCVar2 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
      if (pCVar2->set_global == (set_global_function_t)0x0) {
        pCVar4 = (CatalogException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_e0,"option \"%s\" cannot be set globally",(allocator *)&local_c0
                  );
        ::std::__cxx11::string::string((string *)&local_88,(string *)name);
        CatalogException::CatalogException<std::__cxx11::string>(pCVar4,&local_e0,&local_88);
        __cxa_throw(pCVar4,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
      db = DatabaseInstance::GetDatabase(context->client);
      pDVar1 = DBConfig::GetConfig(context->client);
      pCVar2 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator*(&option);
      DBConfig::SetOption(pDVar1,db,pCVar2,&input_val);
    }
    Value::~Value(&input_val);
  }
  return FINISHED;
}

Assistant:

SourceResultType PhysicalSet::GetData(ExecutionContext &context, DataChunk &chunk, OperatorSourceInput &input) const {
	auto &config = DBConfig::GetConfig(context.client);
	// check if we are allowed to change the configuration option
	config.CheckLock(name);
	auto option = DBConfig::GetOptionByName(name);
	if (!option) {
		// check if this is an extra extension variable
		auto entry = config.extension_parameters.find(name);
		if (entry == config.extension_parameters.end()) {
			Catalog::AutoloadExtensionByConfigName(context.client, name);
			entry = config.extension_parameters.find(name);
			D_ASSERT(entry != config.extension_parameters.end());
		}
		SetExtensionVariable(context.client, entry->second, name, scope, value);
		return SourceResultType::FINISHED;
	}
	SetScope variable_scope = scope;
	if (variable_scope == SetScope::AUTOMATIC) {
		if (option->set_local) {
			variable_scope = SetScope::SESSION;
		} else {
			D_ASSERT(option->set_global);
			variable_scope = SetScope::GLOBAL;
		}
	}

	Value input_val = value.CastAs(context.client, DBConfig::ParseLogicalType(option->parameter_type));
	switch (variable_scope) {
	case SetScope::GLOBAL: {
		if (!option->set_global) {
			throw CatalogException("option \"%s\" cannot be set globally", name);
		}
		auto &db = DatabaseInstance::GetDatabase(context.client);
		auto &config = DBConfig::GetConfig(context.client);
		config.SetOption(&db, *option, input_val);
		break;
	}
	case SetScope::SESSION:
		if (!option->set_local) {
			throw CatalogException("option \"%s\" cannot be set locally", name);
		}
		option->set_local(context.client, input_val);
		break;
	default:
		throw InternalException("Unsupported SetScope for variable");
	}

	return SourceResultType::FINISHED;
}